

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O2

SRes SeqInStream_Read2(ISeqInStream *stream,void *buf,size_t size,SRes errorType)

{
  SRes SVar1;
  size_t processed;
  size_t local_30;
  
  while( true ) {
    if (size == 0) {
      return 0;
    }
    local_30 = size;
    SVar1 = (*stream->Read)(stream,buf,&local_30);
    if (SVar1 != 0) break;
    if (local_30 == 0) {
      return errorType;
    }
    buf = (void *)((long)buf + local_30);
    size = size - local_30;
  }
  return SVar1;
}

Assistant:

SRes SeqInStream_Read2(ISeqInStream *stream, void *buf, size_t size, SRes errorType)
{
  while (size != 0)
  {
    size_t processed = size;
    RINOK(stream->Read(stream, buf, &processed));
    if (processed == 0)
      return errorType;
    buf = (void *)((Byte *)buf + processed);
    size -= processed;
  }
  return SZ_OK;
}